

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_has_more_data(bitstream *str)

{
  byte bVar1;
  int *in_RDI;
  int offs;
  int byte;
  int local_18;
  uint local_14;
  int local_4;
  
  if (*in_RDI == 0) {
    fprintf(_stderr,"vs_has_more_data called in encode mode\n");
    local_4 = -1;
  }
  else {
    local_18 = 0;
    if (in_RDI[0xb] == 1) {
      if ((in_RDI[0xc] != 0) &&
         (((1 << ((char)in_RDI[7] + 1U & 0x1f)) - 1U & (uint)*(byte *)(in_RDI + 6)) != 0)) {
        return 1;
      }
    }
    else {
      if (in_RDI[0xb] != 3) {
        abort();
      }
      if (in_RDI[0xc] == 0) {
        if (in_RDI[8] == in_RDI[4]) {
          fprintf(_stderr,"no RBSP trailer byte\n");
          return -1;
        }
        local_18 = 1;
        bVar1 = *(byte *)(*(long *)(in_RDI + 2) + (long)in_RDI[8]);
      }
      else {
        bVar1 = *(byte *)(in_RDI + 6);
        local_18 = 0;
      }
      local_14 = (uint)bVar1;
      if (((1 << ((char)in_RDI[7] + 1U & 0x1f)) - 1U & local_14) != 1 << ((byte)in_RDI[7] & 0x1f)) {
        return 1;
      }
    }
    local_18 = in_RDI[8] + local_18;
    if ((local_18 < in_RDI[4]) && (*(char *)(*(long *)(in_RDI + 2) + (long)local_18) != '\0')) {
      local_4 = 1;
    }
    else if ((local_18 + 1 < in_RDI[4]) &&
            (*(char *)(*(long *)(in_RDI + 2) + (long)(local_18 + 1)) != '\0')) {
      local_4 = 1;
    }
    else if ((local_18 + 2 < in_RDI[4]) &&
            (2 < *(byte *)(*(long *)(in_RDI + 2) + (long)(local_18 + 2)))) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int vs_has_more_data(struct bitstream *str) {
	if (str->dir == VS_ENCODE) {
		fprintf (stderr, "vs_has_more_data called in encode mode\n");
		return -1;
	}
	int byte;
	int offs = 0;
	switch (str->type) {
		case VS_H264:
			if (!str->hasbyte) {
				if (str->bytepos == str->bytesnum) {
					fprintf (stderr, "no RBSP trailer byte\n");
					return -1;
				}
				offs = 1;
				byte = str->bytes[str->bytepos];
			} else {
				byte = str->curbyte;
				offs = 0;
			}
			byte &= (1 << (str->bitpos+1)) - 1;
			if (byte != (1 << str->bitpos))
				return 1;
			break;
		case VS_H262:
			byte = str->curbyte;
			byte &= (1 << (str->bitpos+1)) - 1;
			if (str->hasbyte && byte)
				return 1;
			break;
		default:
			abort();
	}
	offs += str->bytepos;
	if (offs < str->bytesnum && str->bytes[offs])
		return 1;
	if (offs+1 < str->bytesnum && str->bytes[offs+1])
		return 1;
	if (offs+2 < str->bytesnum && str->bytes[offs+2] > 2)
		return 1;
	/* followed by 00 00 00 or 00 00 01 or 00* EOF */
	return 0;

}